

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

mz_bool tinyexr::miniz::mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes)

{
  ulong min_new_capacity;
  mz_zip_internal_state *pArray;
  size_t sVar1;
  mz_bool mVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  size_t orig_size;
  undefined6 in_stack_0000000a;
  uint6 in_stack_00000032;
  undefined2 in_stack_0000003a;
  undefined4 local_88;
  int6 local_84;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined2 uStack_7c;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 uStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  mz_uint16 local_74;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined8 uStack_6c;
  undefined2 local_64;
  mz_uint16 local_62;
  undefined1 local_60;
  undefined1 local_5f;
  mz_uint16 local_5e;
  undefined1 local_5c;
  undefined1 local_5b;
  mz_uint32 central_dir_ofs;
  ulong local_48;
  void *local_40;
  char *local_38;
  
  pArray = pZip->m_pState;
  uVar4 = (pArray->m_central_dir).m_size;
  central_dir_ofs = (mz_uint32)uVar4;
  if (in_stack_00000032 >> 0x10 != 0) {
    return 0;
  }
  uVar6 = (ulong)filename_size;
  local_48 = (ulong)extra_size;
  if (local_48 + uVar6 + uVar4 + 0x2e >> 0x20 != 0) {
    return 0;
  }
  local_64 = 0;
  local_88 = 0x2014b50;
  bVar5 = 0x14;
  if ((short)comp_size == 0) {
    bVar5 = 0;
  }
  _local_84 = CONCAT17((char)(comp_size >> 8),CONCAT16((char)comp_size,(uint6)bVar5 << 0x10));
  _uStack_7c = CONCAT17((char)(uncomp_size >> 0x18),
                        CONCAT16((char)(uncomp_size >> 0x10),
                                 CONCAT15((char)(uncomp_size >> 8),
                                          CONCAT14((char)uncomp_size,
                                                   CONCAT13((char)(method >> 8),
                                                            CONCAT12((char)method,
                                                                     (undefined2)uncomp_crc32))))));
  _local_74 = CONCAT17((char)((ulong)pComment >> 0x18),
                       CONCAT16((char)((ulong)pComment >> 0x10),
                                CONCAT15((char)((ulong)pComment >> 8),
                                         CONCAT14((char)pComment,
                                                  CONCAT13((char)((uint6)in_stack_0000000a >> 8),
                                                           CONCAT12((char)in_stack_0000000a,
                                                                    comment_size))))));
  uStack_6c = (ulong)CONCAT15((char)(extra_size >> 8),CONCAT14((char)extra_size,(uint)filename_size)
                             );
  local_60 = (undefined1)in_stack_0000003a;
  local_5f = (undefined1)((ushort)in_stack_0000003a >> 8);
  local_5c = (undefined1)in_stack_00000032;
  local_5b = (undefined1)(in_stack_00000032 >> 8);
  uVar3 = uVar4 + 0x2e;
  local_40 = pExtra;
  local_38 = pFilename;
  if ((pArray->m_central_dir).m_capacity < uVar3) {
    local_62 = dos_time;
    local_5e = bit_flags;
    mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1);
    dos_time = local_62;
    bit_flags = local_5e;
    if (mVar2 != 0) goto LAB_0011f75d;
LAB_0011f882:
    if ((pArray->m_central_dir).m_capacity < uVar4) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar4,0);
      if (mVar2 == 0) {
        return 0;
      }
    }
    (pArray->m_central_dir).m_size = uVar4;
    mVar2 = 0;
  }
  else {
LAB_0011f75d:
    (pArray->m_central_dir).m_size = uVar3;
    uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
    local_62 = dos_time;
    local_5e = bit_flags;
    memcpy((void *)(uVar4 * uVar3 + (long)(pArray->m_central_dir).m_p),&local_88,uVar3 * 0x2e);
    sVar1 = (pArray->m_central_dir).m_size;
    uVar3 = uVar6 + sVar1;
    if ((pArray->m_central_dir).m_capacity < uVar3) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1);
      if (mVar2 == 0) goto LAB_0011f882;
    }
    (pArray->m_central_dir).m_size = uVar3;
    uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),local_38,uVar6 * uVar3);
    uVar6 = (pArray->m_central_dir).m_size;
    uVar3 = (pArray->m_central_dir).m_capacity;
    if (uVar3 < uVar6) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar6,1);
      if (mVar2 == 0) goto LAB_0011f882;
      uVar3 = (pArray->m_central_dir).m_capacity;
    }
    (pArray->m_central_dir).m_size = uVar6;
    min_new_capacity = uVar6 + local_48;
    if (uVar3 < min_new_capacity) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,min_new_capacity,1);
      if (mVar2 == 0) goto LAB_0011f882;
    }
    (pArray->m_central_dir).m_size = min_new_capacity;
    uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar6 * uVar3 + (long)(pArray->m_central_dir).m_p),local_40,local_48 * uVar3);
    sVar1 = (pArray->m_central_dir_offsets).m_size;
    uVar6 = sVar1 + 1;
    if ((pArray->m_central_dir_offsets).m_capacity < uVar6) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar6,1);
      if (mVar2 == 0) goto LAB_0011f882;
    }
    (pArray->m_central_dir_offsets).m_size = uVar6;
    uVar4 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
    memcpy((void *)(sVar1 * uVar4 + (long)(pArray->m_central_dir_offsets).m_p),&central_dir_ofs,
           uVar4);
    mVar2 = 1;
  }
  return mVar2;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(
    mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
    const void *pExtra, mz_uint16 extra_size, const void *pComment,
    mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs,
    mz_uint32 ext_attributes) {
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
  size_t orig_central_dir_size = pState->m_central_dir.m_size;
  mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

  // No zip64 support yet
  if ((local_header_ofs > 0xFFFFFFFF) ||
      (((mz_uint64)pState->m_central_dir.m_size +
        MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size +
        comment_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_central_dir_header(
          pZip, central_dir_header, filename_size, extra_size, comment_size,
          uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time,
          dos_date, local_header_ofs, ext_attributes))
    return MZ_FALSE;

  if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header,
                               MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename,
                               filename_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra,
                               extra_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment,
                               comment_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets,
                               &central_dir_ofs, 1))) {
    // Try to push the central directory array back into its original state.
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  return MZ_TRUE;
}